

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O0

exr_result_t
exr_decoding_update(exr_const_context_t ctxt,int part_index,exr_chunk_info_t *cinfo,
                   exr_decode_pipeline_t *decode)

{
  _internal_exr_part *in_RCX;
  _internal_exr_context *in_RDX;
  int in_ESI;
  exr_attribute_t **in_RDI;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_result_t rv;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar1;
  
  if (in_RDI == (exr_attribute_t **)0x0) {
    eVar1 = 2;
  }
  else if (*(char *)in_RDI == '\0') {
    if ((in_ESI < 0) || (*(int *)((long)in_RDI + 0xc4) <= in_ESI)) {
      eVar1 = (*(code *)in_RDI[9])(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else if ((in_RDX == (_internal_exr_context *)0x0) || (in_RCX == (_internal_exr_part *)0x0)) {
      eVar1 = (*(code *)in_RDI[7])(in_RDI,3);
    }
    else if (((in_RCX->attributes).entries == in_RDI) &&
            ((in_RCX->attributes).num_alloced == in_ESI)) {
      eVar1 = internal_coding_update_channel_info
                        ((exr_coding_channel_info_t *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         (int16_t)((ulong)in_RDI >> 0x30),
                         (exr_chunk_info_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                         in_RCX);
      memcpy(&(in_RCX->attributes).sorted_entries,in_RDX,0x40);
    }
    else {
      eVar1 = (*(code *)in_RDI[8])
                        (in_RDI,3,
                         "Invalid request for decoding update from different context / part");
    }
  }
  else {
    eVar1 = (*(code *)in_RDI[7])(in_RDI,7);
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_decoding_update (
    exr_const_context_t     ctxt,
    int                     part_index,
    const exr_chunk_info_t* cinfo,
    exr_decode_pipeline_t*  decode)
{
    exr_result_t rv;
    EXR_PROMOTE_READ_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);
    if (!cinfo || !decode)
        return pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT);

    if (decode->context != ctxt || decode->part_index != part_index)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for decoding update from different context / part");

    rv = internal_coding_update_channel_info (
        decode->channels, decode->channel_count, cinfo, pctxt, part);
    decode->chunk = *cinfo;

    return rv;
}